

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDMeshFragmentGrid *
ON_SubDMeshFragmentGrid::QuadGridFromSideSegmentCount
          (ON_SubDMeshFragmentGrid *__return_storage_ptr__,uint side_segment_count,
          uint mesh_density_reduction)

{
  uint display_density_00;
  uint uVar1;
  uint display_density;
  uint mesh_density_reduction_local;
  uint side_segment_count_local;
  
  display_density_00 = ON_SubDMeshFragment::DisplayDensityFromSideSegmentCount(side_segment_count);
  uVar1 = ON_SubDMeshFragment::SideSegmentCountFromDisplayDensity(display_density_00);
  if (side_segment_count == uVar1) {
    QuadGridFromDisplayDensity(__return_storage_ptr__,display_density_00,mesh_density_reduction);
  }
  else {
    ON_SubDIncrementErrorCount();
    memcpy(__return_storage_ptr__,&Empty,0x30);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SubDMeshFragmentGrid ON_SubDMeshFragmentGrid::QuadGridFromSideSegmentCount(
  unsigned int side_segment_count,
  unsigned int mesh_density_reduction
)
{
  const unsigned int display_density = ON_SubDMeshFragment::DisplayDensityFromSideSegmentCount(side_segment_count);
  if ( side_segment_count != ON_SubDMeshFragment::SideSegmentCountFromDisplayDensity(display_density) )
    return ON_SUBD_RETURN_ERROR(ON_SubDMeshFragmentGrid::Empty);
  return ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(display_density, mesh_density_reduction);
}